

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentPOMDP.cpp
# Opt level: O2

void __thiscall
AgentPOMDP::AgentPOMDP
          (AgentPOMDP *this,PlanningUnitDecPOMDPDiscrete *pu,Index id,
          QAV<PerseusPOMDPPlanner> *QPOMDP)

{
  int iVar1;
  undefined4 extraout_var;
  
  (this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete.super_SimulationAgent._m_id = id
  ;
  (this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete.super_SimulationAgent._m_verbose
       = false;
  (this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete._m_pu = pu;
  (this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete.super_SimulationAgent.
  _vptr_SimulationAgent = (_func_int **)&PTR__AgentPOMDP_005df2c0;
  this->_m_QPOMDP = QPOMDP;
  this->_m_t = 0;
  iVar1 = (*(pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[10])(pu);
  this->_m_jb = (JointBeliefInterface *)CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

AgentPOMDP::AgentPOMDP(const PlanningUnitDecPOMDPDiscrete *pu, Index id,
                       QAV<PerseusPOMDPPlanner> *QPOMDP) :
    AgentSharedObservations(pu,id),
    _m_QPOMDP(QPOMDP),
    _m_t(0)
{
    _m_jb=GetPU()->GetNewJointBeliefInterface();
}